

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void Fl::copy_image(uchar *data,int W,int H,int clipboard)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  Atom AVar7;
  uchar *puVar8;
  long lVar9;
  int iVar10;
  
  if ((H < 1 || W < 1) || data == (uchar *)0x0) {
    return;
  }
  if (fl_selection_buffer[clipboard] != (char *)0x0) {
    operator_delete__(fl_selection_buffer[clipboard]);
  }
  uVar3 = W * 3 + 3U & 0x7ffffffc;
  iVar10 = uVar3 * H;
  uVar1 = iVar10 + 0x36;
  pcVar4 = (char *)operator_new__((ulong)uVar1);
  pcVar4[0] = 'B';
  pcVar4[1] = 'M';
  pcVar4[2] = (char)uVar1;
  pcVar4[3] = (char)(uVar1 >> 8);
  pcVar4[4] = (char)(uVar1 >> 0x10);
  pcVar4[5] = (char)(uVar1 >> 0x18);
  iVar5 = 0;
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  pcVar4[8] = '\0';
  pcVar4[9] = '\0';
  pcVar4[10] = '6';
  pcVar4[0xb] = '\0';
  pcVar4[0xc] = '\0';
  pcVar4[0xd] = '\0';
  pcVar4[0xe] = '(';
  pcVar4[0xf] = '\0';
  pcVar4[0x10] = '\0';
  pcVar4[0x11] = '\0';
  pcVar4[0x12] = (char)W;
  pcVar4[0x13] = (char)((uint)W >> 8);
  pcVar4[0x14] = (char)((uint)W >> 0x10);
  pcVar4[0x15] = (char)((uint)W >> 0x18);
  pcVar4[0x16] = (char)H;
  pcVar4[0x17] = (char)((uint)H >> 8);
  pcVar4[0x18] = (char)((uint)H >> 0x10);
  pcVar4[0x19] = (char)((uint)H >> 0x18);
  pcVar4[0x1a] = '\x01';
  pcVar4[0x1b] = '\0';
  pcVar4[0x1c] = '\x18';
  pcVar4[0x1d] = '\0';
  pcVar4[0x1e] = '\0';
  pcVar4[0x1f] = '\0';
  pcVar4[0x20] = '\0';
  pcVar4[0x21] = '\0';
  pcVar4[0x22] = (char)iVar10;
  pcVar4[0x23] = (char)((uint)iVar10 >> 8);
  pcVar4[0x24] = (char)((uint)iVar10 >> 0x10);
  pcVar4[0x25] = (char)((uint)iVar10 >> 0x18);
  pcVar4[0x26] = '\0';
  pcVar4[0x27] = '\0';
  pcVar4[0x28] = '\0';
  pcVar4[0x29] = '\0';
  pcVar4[0x2a] = '\0';
  pcVar4[0x2b] = '\0';
  pcVar4[0x2c] = '\0';
  pcVar4[0x2d] = '\0';
  pcVar4[0x2e] = '\0';
  pcVar4[0x2f] = '\0';
  pcVar4[0x30] = '\0';
  pcVar4[0x31] = '\0';
  pcVar4[0x32] = '\0';
  pcVar4[0x33] = '\0';
  pcVar4[0x34] = '\0';
  pcVar4[0x35] = '\0';
  if (0 < H) {
    uVar2 = W * 3;
    pcVar6 = pcVar4 + 0x36;
    puVar8 = data + ((ulong)(uVar2 * H) - (ulong)uVar2) + 2;
    do {
      if (0 < W) {
        lVar9 = 0;
        iVar10 = W;
        do {
          pcVar6[lVar9] = puVar8[lVar9];
          pcVar6[lVar9 + 1] = puVar8[lVar9 + -1];
          pcVar6[lVar9 + 2] = puVar8[lVar9 + -2];
          lVar9 = lVar9 + 3;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      pcVar6 = pcVar6 + uVar3;
      iVar5 = iVar5 + 1;
      puVar8 = puVar8 + -(ulong)uVar2;
    } while (iVar5 != H);
  }
  fl_selection_length[clipboard] = uVar1;
  fl_selection_buffer[clipboard] = pcVar4;
  fl_selection_buffer_length[clipboard] = uVar1;
  fl_i_own_selection[clipboard] = '\x01';
  fl_selection_type[clipboard] = "image";
  AVar7 = 1;
  if (clipboard != 0) {
    AVar7 = CLIPBOARD;
  }
  XSetSelectionOwner(fl_display,AVar7,fl_message_window,fl_event_time);
  return;
}

Assistant:

void Fl::copy_image(const unsigned char *data, int W, int H, int clipboard){
  if(!data || W<=0 || H<=0) return;
  delete[] fl_selection_buffer[clipboard];
  fl_selection_buffer[clipboard] = (char *) create_bmp(data,W,H,&fl_selection_length[clipboard]);
  fl_selection_buffer_length[clipboard] = fl_selection_length[clipboard];
  fl_i_own_selection[clipboard] = 1;
  fl_selection_type[clipboard] = Fl::clipboard_image;

  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  XSetSelectionOwner(fl_display, property, fl_message_window, fl_event_time);
}